

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O2

bool __thiscall ON_ArcCurve::ChangeClosedCurveSeam(ON_ArcCurve *this,double t)

{
  ON_Arc *this_00;
  ON_Interval *this_01;
  double dVar1;
  bool bVar2;
  ON_3dVector *axis;
  double *pdVar3;
  ON_Interval local_30;
  
  this_00 = &this->m_arc;
  bVar2 = ON_Arc::IsCircle(this_00);
  if (bVar2) {
    this_01 = &this->m_t;
    dVar1 = ON_Interval::NormalizedParameterAt(this_01,t);
    axis = ON_Plane::Normal((ON_Plane *)this_00);
    ON_Circle::Rotate(&this_00->super_ON_Circle,dVar1 * 6.283185307179586,axis);
    pdVar3 = ON_Interval::operator[](this_01,1);
    dVar1 = *pdVar3;
    pdVar3 = ON_Interval::operator[](this_01,0);
    ON_Interval::ON_Interval(&local_30,t,(dVar1 + t) - *pdVar3);
    (this->m_t).m_t[0] = local_30.m_t[0];
    (this->m_t).m_t[1] = local_30.m_t[1];
  }
  return bVar2;
}

Assistant:

bool ON_ArcCurve::ChangeClosedCurveSeam( 
            double t ){
	bool rc = false;
	if( IsCircle() ){
		double angle_delta = m_t.NormalizedParameterAt(t);
		angle_delta*= 2*ON_PI;
		
		m_arc.Rotate(angle_delta, m_arc.plane.Normal());
		m_t = ON_Interval( t, m_t[1] + t - m_t[0]);
		rc = true;
	}
	return rc;
}